

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.h
# Opt level: O3

void __thiscall
slang::ast::SequenceWithMatchExpr::visitExprs<LookupIdentifier&>
          (SequenceWithMatchExpr *this,LookupIdentifier *visitor)

{
  size_t sVar1;
  pointer ppEVar2;
  Expression *this_00;
  long lVar3;
  
  AssertionExpr::visit<LookupIdentifier>(this->expr,visitor);
  sVar1 = (this->matchItems)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppEVar2 = (this->matchItems)._M_ptr;
    lVar3 = 0;
    do {
      this_00 = *(Expression **)((long)ppEVar2 + lVar3);
      Expression::visitExpression<slang::ast::Expression_const,LookupIdentifier&>
                (this_00,this_00,visitor);
      lVar3 = lVar3 + 8;
    } while (sVar1 << 3 != lVar3);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        expr.visit(visitor);
        for (auto item : matchItems)
            item->visit(visitor);
    }